

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

void loadLists(UPKGOptions *o,UErrorCode *status)

{
  undefined8 uVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  CharList *pCVar8;
  size_t sVar9;
  char *__src;
  bool bVar10;
  char local_4089;
  uint local_406c;
  char *pcStack_4068;
  int32_t ln;
  char *s;
  int32_t tmpLength;
  char *tmp;
  char *pcStack_4048;
  uint32_t lineMax;
  char *lineNext;
  char *linePtr;
  char line [16384];
  FileStream *in;
  CharList *tail2;
  CharList *tail;
  CharList *l;
  UErrorCode *status_local;
  UPKGOptions *o_local;
  
  tail2 = (CharList *)0x0;
  in = (FileStream *)0x0;
  local_406c = 0;
  tail = o->fileListFiles;
  l = (CharList *)status;
  status_local = (UErrorCode *)o;
  do {
    if (tail == (CharList *)0x0) {
      return;
    }
    if (*(byte *)((long)status_local + 0x91) != 0) {
      fprintf(_stdout,"# pkgdata: Reading %s..\n",tail->str);
    }
    line._16376_8_ = T_FileStream_open(tail->str,"r");
    if ((FileStream *)line._16376_8_ == (FileStream *)0x0) {
      fprintf(_stderr,"Error opening <%s>.\n",tail->str);
      *(undefined4 *)&l->str = 4;
      return;
    }
    while (pcVar5 = T_FileStream_readLine((FileStream *)line._16376_8_,(char *)&linePtr,0x4000),
          pcVar5 != (char *)0x0) {
      local_406c = local_406c + 1;
      sVar6 = strlen((char *)&linePtr);
      if (0x3fac < sVar6) {
        fprintf(_stderr,"%s:%d - line too long (over %d chars)\n",tail->str,(ulong)local_406c,0x3fac
               );
        exit(1);
      }
      lineNext = (char *)&linePtr;
      while (iVar3 = isspace((int)*lineNext), iVar3 != 0) {
        lineNext = lineNext + 1;
      }
      for (pcStack_4068 = lineNext; *pcStack_4068 != '\0'; pcStack_4068 = pcStack_4068 + 1) {
        if ((*pcStack_4068 == '\r') || (*pcStack_4068 == '\n')) {
          *pcStack_4068 = '\0';
          break;
        }
      }
      if ((*lineNext != '\0') && (*lineNext != '#')) {
        while( true ) {
          bVar10 = false;
          if (lineNext != (char *)0x0) {
            bVar10 = *lineNext != '\0';
          }
          if (!bVar10) break;
          for (; *lineNext == ' '; lineNext = lineNext + 1) {
          }
          if (*lineNext == '\"') {
            pcVar5 = strchr(lineNext + 1,0x22);
            if (pcVar5 == (char *)0x0) {
              fprintf(_stderr,"%s:%d - missing trailing double quote (\")\n",tail->str,
                      (ulong)local_406c);
              exit(1);
            }
            pcStack_4048 = pcVar5 + 1;
            if (*pcStack_4048 != '\0') {
              if (*pcStack_4048 != ' ') {
                if (*pcStack_4048 == '\0') {
                  local_4089 = '0';
                }
                else {
                  local_4089 = *pcStack_4048;
                }
                fprintf(_stderr,
                        "%s:%d - malformed quoted line at position %d, expected \' \' got \'%c\'\n",
                        tail->str,(ulong)local_406c,(ulong)(uint)((int)pcStack_4048 - (int)&linePtr)
                        ,(ulong)(uint)(int)local_4089);
                exit(1);
              }
              *pcStack_4048 = '\0';
              pcStack_4048 = pcVar5 + 2;
            }
          }
          else {
            pcStack_4048 = strchr(lineNext,0x20);
            if (pcStack_4048 != (char *)0x0) {
              *pcStack_4048 = '\0';
              pcStack_4048 = pcStack_4048 + 1;
            }
          }
          pcVar5 = getLongPathname(lineNext);
          pCVar8 = *(CharList **)(status_local + 4);
          pcVar7 = uprv_strdup_63(lineNext);
          pCVar8 = pkg_appendToList(pCVar8,&tail2,pcVar7);
          *(CharList **)(status_local + 4) = pCVar8;
          UVar2 = uprv_pathIsAbsolute_63(pcVar5);
          if ((UVar2 != '\0') || (*pcVar5 == '.')) {
            fprintf(_stderr,
                    "pkgdata: Error: absolute path encountered. Old style paths are not supported. Use relative paths such as \'fur.res\' or \'translit%cfur.res\'.\n\tBad path: \'%s\'\n"
                    ,0x2f,pcVar5);
            exit(1);
          }
          sVar6 = strlen(*(char **)(status_local + 0x14));
          sVar9 = strlen(pcVar5);
          uVar4 = (int)sVar6 + (int)sVar9 + 5;
          pcVar7 = (char *)uprv_malloc_63((long)(int)uVar4);
          if (pcVar7 == (char *)0x0) {
            fprintf(_stderr,"pkgdata: Error: Unable to allocate tmp buffer size: %d\n",(ulong)uVar4)
            ;
            exit(7);
          }
          strcpy(pcVar7,*(char **)(status_local + 0x14));
          uVar1 = *(undefined8 *)(status_local + 0x14);
          sVar6 = strlen(*(char **)(status_local + 0x14));
          __src = "/";
          if (*(char *)(uVar1 + (sVar6 - 1)) == '/') {
            __src = "";
          }
          strcat(pcVar7,__src);
          strcat(pcVar7,pcVar5);
          pCVar8 = pkg_appendToList(*(CharList **)(status_local + 2),(CharList **)&in,pcVar7);
          *(CharList **)(status_local + 2) = pCVar8;
          lineNext = pcStack_4048;
        }
      }
    }
    T_FileStream_close((FileStream *)line._16376_8_);
    tail = tail->next;
  } while( true );
}

Assistant:

static void loadLists(UPKGOptions *o, UErrorCode *status)
{
    CharList   *l, *tail = NULL, *tail2 = NULL;
    FileStream *in;
    char        line[16384];
    char       *linePtr, *lineNext;
    const uint32_t   lineMax = 16300;
    char       *tmp;
    int32_t     tmpLength = 0;
    char       *s;
    int32_t     ln=0; /* line number */

    for(l = o->fileListFiles; l; l = l->next) {
        if(o->verbose) {
            fprintf(stdout, "# pkgdata: Reading %s..\n", l->str);
        }
        /* TODO: stdin */
        in = T_FileStream_open(l->str, "r"); /* open files list */

        if(!in) {
            fprintf(stderr, "Error opening <%s>.\n", l->str);
            *status = U_FILE_ACCESS_ERROR;
            return;
        }

        while(T_FileStream_readLine(in, line, sizeof(line))!=NULL) { /* for each line */
            ln++;
            if(uprv_strlen(line)>lineMax) {
                fprintf(stderr, "%s:%d - line too long (over %d chars)\n", l->str, (int)ln, (int)lineMax);
                exit(1);
            }
            /* remove spaces at the beginning */
            linePtr = line;
            /* On z/OS, disable call to isspace (#9996).  Investigate using uprv_isspace instead (#9999) */
#if U_PLATFORM != U_PF_OS390
            while(isspace(*linePtr)) {
                linePtr++;
            }
#endif
            s=linePtr;
            /* remove trailing newline characters */
            while(*s!=0) {
                if(*s=='\r' || *s=='\n') {
                    *s=0;
                    break;
                }
                ++s;
            }
            if((*linePtr == 0) || (*linePtr == '#')) {
                continue; /* comment or empty line */
            }

            /* Now, process the line */
            lineNext = NULL;

            while(linePtr && *linePtr) { /* process space-separated items */
                while(*linePtr == ' ') {
                    linePtr++;
                }
                /* Find the next quote */
                if(linePtr[0] == '"')
                {
                    lineNext = uprv_strchr(linePtr+1, '"');
                    if(lineNext == NULL) {
                        fprintf(stderr, "%s:%d - missing trailing double quote (\")\n",
                            l->str, (int)ln);
                        exit(1);
                    } else {
                        lineNext++;
                        if(*lineNext) {
                            if(*lineNext != ' ') {
                                fprintf(stderr, "%s:%d - malformed quoted line at position %d, expected ' ' got '%c'\n",
                                    l->str, (int)ln, (int)(lineNext-line), (*lineNext)?*lineNext:'0');
                                exit(1);
                            }
                            *lineNext = 0;
                            lineNext++;
                        }
                    }
                } else {
                    lineNext = uprv_strchr(linePtr, ' ');
                    if(lineNext) {
                        *lineNext = 0; /* terminate at space */
                        lineNext++;
                    }
                }

                /* add the file */
                s = (char*)getLongPathname(linePtr);

                /* normal mode.. o->files is just the bare list without package names */
                o->files = pkg_appendToList(o->files, &tail, uprv_strdup(linePtr));
                if(uprv_pathIsAbsolute(s) || s[0] == '.') {
                    fprintf(stderr, "pkgdata: Error: absolute path encountered. Old style paths are not supported. Use relative paths such as 'fur.res' or 'translit%cfur.res'.\n\tBad path: '%s'\n", U_FILE_SEP_CHAR, s);
                    exit(U_ILLEGAL_ARGUMENT_ERROR);
                }
                tmpLength = uprv_strlen(o->srcDir) + 
                            uprv_strlen(s) + 5; /* 5 is to add a little extra space for, among other things, PKGDATA_FILE_SEP_STRING */
                if((tmp = (char *)uprv_malloc(tmpLength)) == NULL) {
                    fprintf(stderr, "pkgdata: Error: Unable to allocate tmp buffer size: %d\n", tmpLength);
                    exit(U_MEMORY_ALLOCATION_ERROR);
                }
                uprv_strcpy(tmp, o->srcDir);
                uprv_strcat(tmp, o->srcDir[uprv_strlen(o->srcDir)-1] == U_FILE_SEP_CHAR ? "" : PKGDATA_FILE_SEP_STRING);
                uprv_strcat(tmp, s);
                o->filePaths = pkg_appendToList(o->filePaths, &tail2, tmp);
                linePtr = lineNext;
            } /* for each entry on line */
        } /* for each line */
        T_FileStream_close(in);
    } /* for each file list file */
}